

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasyMesh::ChBodyEasyMesh
          (ChBodyEasyMesh *this,string *filename,double density,bool compute_mass,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material,double sphere_swept,
          shared_ptr<chrono::collision::ChCollisionModel> *collision_model)

{
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChMaterialSurface> local_80;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_70;
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pointer local_40;
  pointer local_38;
  
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW =
       (ChLoadableUVW)&PTR__ChLoadable_00b2c638;
  local_60._16_8_ =
       (collision_model->
       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (collision_model->
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_40 = (pointer)density;
  local_38 = (pointer)sphere_swept;
  ChBodyAuxRef::ChBodyAuxRef
            (&this->super_ChBodyAuxRef,&PTR_construction_vtable_24__00b303a8,
             (shared_ptr<chrono::collision::ChCollisionModel> *)(local_60 + 0x10));
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)0xb2fe48;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChBodyFrame.super_ChFrameMoving<double>.
  super_ChFrame<double>._vptr_ChFrame = (_func_int **)0xb30148;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.super_ChContactable.
  _vptr_ChContactable = (_func_int **)0xb301e0;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.
  super_ChVariableTupleCarrier_1vars<6>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x458);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW = (ChLoadableUVW)0xb30318;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_60,filename,true,true);
  local_70.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_60._0_8_;
  local_70.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
    }
  }
  local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SetupBody(this,&local_70,filename,(double)local_40,compute_mass,visualize,collide,&local_80,
            (double)local_38);
  if (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

ChBodyEasyMesh::ChBodyEasyMesh(const std::string& filename,
                               double density,
                               bool compute_mass,
                               bool visualize,
                               bool collide,
                               std::shared_ptr<ChMaterialSurface> material,
                               double sphere_swept,
                               std::shared_ptr<collision::ChCollisionModel> collision_model)
    : ChBodyAuxRef(collision_model) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(filename, true, true);
    SetupBody(trimesh, filename, density, compute_mass, visualize, collide, material, sphere_swept);
}